

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O3

bool __thiscall
ClownLZSS::Internal::BitField::
Reader<2U,_(ClownLZSS::Internal::BitField::ReadWhen)1,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
::Pop(Reader<2U,_(ClownLZSS::Internal::BitField::ReadWhen)1,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
      *this)

{
  uint *puVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = this->bits;
  this->bits = uVar2 >> 1;
  puVar1 = &this->bits_remaining;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    this->bits_remaining = 0x10;
    uVar5 = 0;
    bVar3 = true;
    do {
      bVar6 = bVar3;
      uVar4 = std::istream::get();
      uVar5 = (ulong)((uVar4 & 0xff) << 8) | uVar5 >> 8;
      bVar3 = false;
    } while (bVar6);
    this->bits = uVar5;
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool Pop()
				{
					const auto &CheckReadBits = [&]()
					{
						if (bits_remaining == 0)
							ReadBits();
					};

					if constexpr(read_when == ReadWhen::BeforePop)
						CheckReadBits();

					constexpr unsigned int mask = []() constexpr
					{
						if constexpr(pop_where == PopWhere::High)
							return 1 << (total_bits - 1);
						else if constexpr(pop_where == PopWhere::Low)
							return 1;
					}();

					const bool bit = (bits & mask) != 0;

					if constexpr(pop_where == PopWhere::High)
						bits <<= 1;
					else if constexpr(pop_where == PopWhere::Low)
						bits >>= 1;

					--bits_remaining;

					if constexpr(read_when == ReadWhen::AfterPop)
						CheckReadBits();

					return bit;
				}